

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadSafeFramesQueue.hpp
# Opt level: O0

void __thiscall
ThreadSafeFramesQueue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>::Push
          (ThreadSafeFramesQueue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
           *this,pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> *entry)

{
  size_type sVar1;
  undefined1 local_98 [8];
  pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> elem;
  lock_guard<std::mutex> lock;
  pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> *entry_local;
  ThreadSafeFramesQueue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
  *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)
             &elem.second.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&this->mtx);
  while( true ) {
    sVar1 = std::
            queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
            ::size(&this->
                    super_queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
                  );
    if (sVar1 < this->maxDepth) break;
    std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
    pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_true>
              ((pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> *)local_98);
    Pop(this,(pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> *)local_98);
    std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::~pair
              ((pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> *)local_98);
  }
  std::
  queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
  ::push(&this->
          super_queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
         ,entry);
  std::lock_guard<std::mutex>::~lock_guard
            ((lock_guard<std::mutex> *)
             &elem.second.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Push(const T& entry) noexcept {
    std::lock_guard<std::mutex> lock(mtx);
    //! remove elements that are too old
    while (this->size() >= maxDepth) {
      T elem;
      static_cast<void>(Pop(elem));
    }
    this->push(entry);
  }